

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,
          ArrayPtr<const_char> *rest,String *rest_1,ArrayPtr<const_char> *rest_2,String *rest_3,
          ArrayPtr<const_char> *rest_4)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  size_t __n;
  char *pcVar5;
  
  pcVar5 = (char *)(this->text).content.size_;
  pBVar1 = (this->branches).ptr;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (this->text).content.ptr;
  }
  pBVar1[branchIndex].index = (long)pos - (long)pcVar5;
  pBVar1[branchIndex].content.size_ = first->size_;
  pcVar5 = pBVar1[branchIndex].content.text.content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar2 = pBVar1[branchIndex].content.text.content.size_;
    pBVar1[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar1[branchIndex].content.text.content.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.text.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar5,1,sVar2,sVar2,0);
  }
  pBVar1[branchIndex].content.text.content.ptr = (first->text).content.ptr;
  pBVar1[branchIndex].content.text.content.size_ = (first->text).content.size_;
  pBVar1[branchIndex].content.text.content.disposer = (first->text).content.disposer;
  (first->text).content.ptr = (char *)0x0;
  (first->text).content.size_ = 0;
  pBVar4 = pBVar1[branchIndex].content.branches.ptr;
  if (pBVar4 != (Branch *)0x0) {
    sVar2 = pBVar1[branchIndex].content.branches.size_;
    pBVar1[branchIndex].content.branches.ptr = (Branch *)0x0;
    pBVar1[branchIndex].content.branches.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.branches.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar4,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pBVar1[branchIndex].content.branches.ptr = (first->branches).ptr;
  pBVar1[branchIndex].content.branches.size_ = (first->branches).size_;
  pBVar1[branchIndex].content.branches.disposer = (first->branches).disposer;
  (first->branches).ptr = (Branch *)0x0;
  (first->branches).size_ = 0;
  __n = rest->size_;
  if (__n != 0) {
    memcpy(pos,rest->ptr,__n);
    pos = pos + __n;
  }
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest_1,rest_2,rest_3,rest_4);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}